

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::EvalConstantValUint64
          (ValidationState_t *this,uint32_t id,uint64_t *val)

{
  uint16_t uVar1;
  uint uVar2;
  pointer puVar3;
  Instruction *pIVar4;
  Instruction *pIVar5;
  ulong uVar6;
  long lVar7;
  
  pIVar4 = FindDef(this,id);
  if (pIVar4 == (Instruction *)0x0) {
    __assert_fail("0 && \"Instruction not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x55e,
                  "bool spvtools::val::ValidationState_t::EvalConstantValUint64(uint32_t, uint64_t *) const"
                 );
  }
  pIVar5 = FindDef(this,(pIVar4->inst_).type_id);
  if ((pIVar5 == (Instruction *)0x0) || ((pIVar5->inst_).opcode != 0x15)) {
    uVar6 = 0;
  }
  else {
    uVar1 = (pIVar4->inst_).opcode;
    uVar6 = 0;
    if (uVar1 != 0x2e) {
      if (uVar1 != 0x2b) goto LAB_003171ae;
      puVar3 = (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)(pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
      if (lVar7 == 5) {
        uVar2 = puVar3[3];
        *val = (ulong)uVar2;
        uVar6 = CONCAT44(puVar3[4],uVar2);
      }
      else {
        if (lVar7 != 4) {
          __assert_fail("inst->words().size() == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                        ,0x56d,
                        "bool spvtools::val::ValidationState_t::EvalConstantValUint64(uint32_t, uint64_t *) const"
                       );
        }
        uVar6 = (ulong)puVar3[3];
      }
    }
    *val = uVar6;
    uVar6 = 1;
  }
LAB_003171ae:
  return SUB81(uVar6,0);
}

Assistant:

bool ValidationState_t::EvalConstantValUint64(uint32_t id,
                                              uint64_t* val) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    assert(0 && "Instruction not found");
    return false;
  }

  if (!IsIntScalarType(inst->type_id())) return false;

  if (inst->opcode() == spv::Op::OpConstantNull) {
    *val = 0;
  } else if (inst->opcode() != spv::Op::OpConstant) {
    // Spec constant values cannot be evaluated so don't consider constant for
    // static validation
    return false;
  } else if (inst->words().size() == 4) {
    *val = inst->word(3);
  } else {
    assert(inst->words().size() == 5);
    *val = inst->word(3);
    *val |= uint64_t(inst->word(4)) << 32;
  }
  return true;
}